

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          MeshAttributeIndicesEncodingData *encoding_data)

{
  TraversalObserver traversal_observer;
  pointer connectivity;
  pointer pMVar1;
  CornerTable *in_RDX;
  PointsSequencer *in_RSI;
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *in_RDI;
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  att_traverser;
  AttObserver att_observer;
  unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  traversal_sequencer;
  pointer in_stack_fffffffffffffe48;
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
  *in_stack_fffffffffffffe50;
  MeshAttributeIndicesEncodingData *in_stack_fffffffffffffe60;
  Mesh *in_stack_fffffffffffffe68;
  MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  *in_stack_fffffffffffffe70;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *this_00;
  Mesh *mesh;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> this_01;
  MeshAttributeIndicesEncodingObserver<draco::CornerTable> local_50;
  CornerTable *local_18;
  
  this_01._M_head_impl = (PointsSequencer *)in_RDI;
  local_18 = in_RDX;
  operator_new(0x110);
  MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::MeshTraversalSequencer
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  this_00 = (TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             *)&stack0xffffffffffffffe0;
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>>
  ::
  unique_ptr<std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>,void>
            ((unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  connectivity = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
                           (in_stack_fffffffffffffe50);
  mesh = (Mesh *)in_RSI[1]._vptr_PointsSequencer;
  pMVar1 = std::
           unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
           ::get((unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                  *)in_stack_fffffffffffffe50);
  MeshAttributeIndicesEncodingObserver<draco::CornerTable>::MeshAttributeIndicesEncodingObserver
            (&local_50,connectivity,mesh,&pMVar1->super_PointsSequencer,
             (MeshAttributeIndicesEncodingData *)local_18);
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::MaxPredictionDegreeTraverser
            ((MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              *)this_01._M_head_impl);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::get
            (in_stack_fffffffffffffe50);
  traversal_observer.encoding_data_ = (MeshAttributeIndicesEncodingData *)in_RDI;
  traversal_observer.att_connectivity_ = (CornerTable *)mesh;
  traversal_observer.mesh_ = (Mesh *)this_01._M_head_impl;
  traversal_observer.sequencer_ = in_RSI;
  TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::Init(this_00,(CornerTable *)in_stack_fffffffffffffe68,traversal_observer);
  pMVar1 = std::
           unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
           ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                         *)0x199a5e);
  MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::SetCornerOrder(pMVar1,(vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           *)(in_RSI + 10));
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                *)0x199a7c);
  MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
  ::SetTraverser((MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
                  *)local_50.encoding_data_,
                 (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  *)local_50.att_connectivity_);
  std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
  unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>>,void>
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             local_50.sequencer_,
             (unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
              *)local_50.mesh_);
  MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  ::~MaxPredictionDegreeTraverser
            ((MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              *)local_50.sequencer_);
  std::
  unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
  ::~unique_ptr((unique_ptr<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>_>_>
                 *)local_50.encoding_data_);
  return (__uniq_ptr_data<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>,_true,_true>
          )(tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
           this_01._M_head_impl;
}

Assistant:

std::unique_ptr<PointsSequencer>
MeshEdgebreakerEncoderImpl<TraversalEncoder>::CreateVertexTraversalSequencer(
    MeshAttributeIndicesEncodingData *encoding_data) {
  typedef typename TraverserT::TraversalObserver AttObserver;
  typedef typename TraverserT::CornerTable CornerTable;

  std::unique_ptr<MeshTraversalSequencer<TraverserT>> traversal_sequencer(
      new MeshTraversalSequencer<TraverserT>(mesh_, encoding_data));

  AttObserver att_observer(corner_table_.get(), mesh_,
                           traversal_sequencer.get(), encoding_data);

  TraverserT att_traverser;
  att_traverser.Init(corner_table_.get(), att_observer);

  // Set order of corners to simulate the corner order of the decoder.
  traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
  traversal_sequencer->SetTraverser(att_traverser);
  return std::move(traversal_sequencer);
}